

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

ImfTiledInputFile * ImfOpenTiledInputFile(char *name)

{
  int numThreads;
  TiledRgbaInputFile *this;
  
  this = (TiledRgbaInputFile *)operator_new(0x38);
  numThreads = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile(this,name,numThreads);
  return (ImfTiledInputFile *)this;
}

Assistant:

ImfTiledInputFile*
ImfOpenTiledInputFile (const char name[])
{
    try
    {
        return (ImfTiledInputFile*) new OPENEXR_IMF_INTERNAL_NAMESPACE::
            TiledRgbaInputFile (name);
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}